

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_gainer_init_preallocated(ma_gainer_config *pConfig,void *pHeap,ma_gainer *pGainer)

{
  ulong uVar1;
  ma_result mVar2;
  ulong uVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (pGainer != (ma_gainer *)0x0) {
    pGainer->_pHeap = (void *)0x0;
    *(undefined8 *)&pGainer->_ownsHeap = 0;
    pGainer->pOldGains = (float *)0x0;
    pGainer->pNewGains = (float *)0x0;
    (pGainer->config).channels = 0;
    (pGainer->config).smoothTimeInFrames = 0;
    pGainer->t = 0;
    pGainer->masterVolume = 0.0;
    if ((pHeap != (void *)0x0 && pConfig != (ma_gainer_config *)0x0) &&
       (uVar3 = (ulong)pConfig->channels, uVar3 != 0)) {
      pGainer->_pHeap = pHeap;
      memset(pHeap,0,uVar3 * 8);
      pGainer->pOldGains = (float *)pHeap;
      pGainer->pNewGains = (float *)((long)pHeap + uVar3 * 4);
      pGainer->masterVolume = 1.0;
      pGainer->config = *pConfig;
      pGainer->t = 0xffffffff;
      for (uVar1 = (ulong)pConfig->channels; mVar2 = MA_SUCCESS, uVar1 != 0; uVar1 = uVar1 - 1) {
        *(undefined4 *)pHeap = 0x3f800000;
        *(undefined4 *)((long)pHeap + uVar3 * 4) = 0x3f800000;
        pHeap = (void *)((long)pHeap + 4);
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_gainer_init_preallocated(const ma_gainer_config* pConfig, void* pHeap, ma_gainer* pGainer)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;
    ma_uint32 iChannel;

    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pGainer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pGainer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pGainer->pOldGains = (float*)ma_offset_ptr(pHeap, heapLayout.oldGainsOffset);
    pGainer->pNewGains = (float*)ma_offset_ptr(pHeap, heapLayout.newGainsOffset);
    pGainer->masterVolume = 1;

    pGainer->config = *pConfig;
    pGainer->t      = (ma_uint32)-1;  /* No interpolation by default. */

    for (iChannel = 0; iChannel < pConfig->channels; iChannel += 1) {
        pGainer->pOldGains[iChannel] = 1;
        pGainer->pNewGains[iChannel] = 1;
    }

    return MA_SUCCESS;
}